

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Expr * __thiscall parser::Parser::parseExpression(Parser *this)

{
  _Elt_pointer ppEVar1;
  Expr *pEVar2;
  
  expand(this);
  if ((this->errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppEVar1 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar1 ==
        (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppEVar1 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pEVar2 = ppEVar1[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&(this->Operands).c);
  }
  else {
    pEVar2 = (Expr *)0x0;
  }
  return pEVar2;
}

Assistant:

Expr* Parser::parseExpression()
{
    expand();
    if(hasErrors())
        return nullptr;
    auto e = Operands.top();
    Operands.pop();
    return e;
}